

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Graph<Node> * __thiscall
Graph<Node>::operator*(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,Graph<Node> *other)

{
  Edge *pEVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Edge *pEVar6;
  Node *pNVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  NodeList<Node> *pNVar16;
  Graph<Node> *ans;
  Graph<Node> g2;
  Graph<Node> g1;
  long local_118;
  Graph<Node> local_100;
  Graph<Node> local_98;
  
  Graph(&local_98,this);
  Graph(&local_100,other);
  pEVar6 = local_98.edges.vect;
  uVar11 = (ulong)local_98.edges._size;
  if (uVar11 != 0) {
    pEVar1 = local_98.edges.vect + uVar11;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.edges.vect,pEVar1,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(pEVar6,pEVar1);
  }
  pEVar6 = local_100.edges.vect;
  uVar11 = (ulong)local_100.edges._size;
  if (uVar11 != 0) {
    pEVar1 = local_100.edges.vect + uVar11;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_100.edges.vect,pEVar1,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(pEVar6,pEVar1);
  }
  if (local_100._nodeCnt < local_98._nodeCnt) {
    local_100._nodeCnt = local_98._nodeCnt;
  }
  Graph(__return_storage_ptr__,local_100._nodeCnt);
  if (0 < local_98._edgeCnt) {
    local_118 = 0;
    do {
      if (0 < local_100._edgeCnt) {
        lVar14 = 8;
        lVar12 = 1;
        bVar10 = false;
        do {
          uVar2 = local_98.edges.vect[local_118]._nodeS;
          iVar3 = local_98.edges.vect[local_118]._nodeD;
          uVar13 = *(uint *)((long)local_100.edges.vect + lVar14 + -8);
          iVar4 = *(int *)((long)local_100.edges.vect + lVar14 + -4);
          iVar15 = *(int *)((long)&(local_100.edges.vect)->_nodeS + lVar14);
          bVar8 = iVar3 == iVar4;
          bVar9 = (uVar2 ^ uVar13) == 0;
          uVar11 = (ulong)CONCAT31((int3)((uVar2 ^ uVar13) >> 8),bVar8 && bVar9);
          if ((bVar8 && bVar9) && (iVar5 = local_98.edges.vect[local_118]._cost, iVar5 < iVar15)) {
            __return_storage_ptr__->_edgeCnt = __return_storage_ptr__->_edgeCnt + 1;
            iVar4 = (__return_storage_ptr__->edges)._capacity;
            if (iVar4 <= (__return_storage_ptr__->edges)._size) {
              vector<Edge>::realloc
                        (&__return_storage_ptr__->edges,(void *)(ulong)(uint)(iVar4 * 2),uVar11);
            }
            iVar4 = (__return_storage_ptr__->edges)._size;
            (__return_storage_ptr__->edges)._size = iVar4 + 1;
            pEVar6 = (__return_storage_ptr__->edges).vect;
            pEVar6[iVar4]._nodeS = uVar2;
            pEVar6[iVar4]._nodeD = iVar3;
            pEVar6[iVar4]._cost = iVar5;
            pNVar16 = (__return_storage_ptr__->G).vect + (int)uVar2;
            iVar4 = (pNVar16->nodes)._capacity;
            if (iVar4 <= (pNVar16->nodes)._size) {
              vector<Node>::realloc(&pNVar16->nodes,(void *)(ulong)(uint)(iVar4 * 2),(size_t)pEVar6)
              ;
            }
            iVar4 = (pNVar16->nodes)._size;
            (pNVar16->nodes)._size = iVar4 + 1;
            pNVar7 = (pNVar16->nodes).vect;
            pNVar7[iVar4]._index = iVar3;
            pNVar7[iVar4]._costTo = iVar5;
            pNVar16 = (__return_storage_ptr__->G).vect + iVar3;
            iVar3 = (pNVar16->nodes)._capacity;
            uVar13 = uVar2;
            iVar15 = iVar5;
            if (iVar3 <= (pNVar16->nodes)._size) {
              vector<Node>::realloc(&pNVar16->nodes,(void *)(ulong)(uint)(iVar3 * 2),(size_t)pNVar7)
              ;
            }
LAB_00101e26:
            iVar3 = (pNVar16->nodes)._size;
            (pNVar16->nodes)._size = iVar3 + 1;
            pNVar7 = (pNVar16->nodes).vect;
            pNVar7[iVar3]._index = uVar13;
            pNVar7[iVar3]._costTo = iVar15;
            bVar10 = true;
          }
          else if (bVar8 && bVar9) {
            __return_storage_ptr__->_edgeCnt = __return_storage_ptr__->_edgeCnt + 1;
            iVar3 = (__return_storage_ptr__->edges)._capacity;
            if (iVar3 <= (__return_storage_ptr__->edges)._size) {
              vector<Edge>::realloc
                        (&__return_storage_ptr__->edges,(void *)(ulong)(uint)(iVar3 * 2),uVar11);
            }
            iVar3 = (__return_storage_ptr__->edges)._size;
            (__return_storage_ptr__->edges)._size = iVar3 + 1;
            pEVar6 = (__return_storage_ptr__->edges).vect;
            pEVar6[iVar3]._nodeS = uVar13;
            pEVar6[iVar3]._nodeD = iVar4;
            pEVar6[iVar3]._cost = iVar15;
            pNVar16 = (__return_storage_ptr__->G).vect + (int)uVar13;
            iVar3 = (pNVar16->nodes)._capacity;
            if (iVar3 <= (pNVar16->nodes)._size) {
              vector<Node>::realloc(&pNVar16->nodes,(void *)(ulong)(uint)(iVar3 * 2),(size_t)pEVar6)
              ;
            }
            iVar3 = (pNVar16->nodes)._size;
            (pNVar16->nodes)._size = iVar3 + 1;
            pNVar7 = (pNVar16->nodes).vect;
            pNVar7[iVar3]._index = iVar4;
            pNVar7[iVar3]._costTo = iVar15;
            pNVar16 = (__return_storage_ptr__->G).vect + iVar4;
            iVar3 = (pNVar16->nodes)._capacity;
            if (iVar3 <= (pNVar16->nodes)._size) {
              vector<Node>::realloc(&pNVar16->nodes,(void *)(ulong)(uint)(iVar3 * 2),(size_t)pNVar7)
              ;
            }
            goto LAB_00101e26;
          }
          if (local_100._edgeCnt <= lVar12) break;
          lVar14 = lVar14 + 0xc;
          lVar12 = lVar12 + 1;
        } while (!bVar10);
      }
      local_118 = local_118 + 1;
    } while (local_118 < local_98._edgeCnt);
  }
  ~Graph(&local_100);
  ~Graph(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Graph operator * (const Graph &other) const {
        Graph g1 = *this;
        Graph g2 = other;

        std::sort(g1.edges.begin(), g1.edges.end());
//        g1.edges.mergeSort(0, g1._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        std::sort(g2.edges.begin(), g2.edges.end());
//        g2.edges.mergeSort(0, g2._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        Graph ans(max(g1.size(), g2.size()));

        for (int i = 0; i < g1.edgeCnt(); ++i) {
            bool added = false;
            for (int j = 0; j < g2.edgeCnt() and !added; ++j) {
                Edge g1Edge = g1.getEdge(i);
                Edge g2Edge = g2.getEdge(j);
                if (g1Edge == g2Edge and g1Edge.getCost() < g2Edge.getCost()) {
                    added = true;
                    ans.addEdge(g1Edge);
                }
                else if (g1Edge == g2Edge) {
                    added = true;
                    ans.addEdge(g2Edge);
                }
            }

//            if (!added) {
//                ans.addEdge(g1.getEdge(i));
//            }
        }

        return ans;
    }